

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crt_abstractions.c
# Opt level: O0

int substricmp(char *nptr,char *subsrt)

{
  int local_2c;
  int local_24;
  int local_1c;
  char *pcStack_18;
  int result;
  char *subsrt_local;
  char *nptr_local;
  
  local_1c = 0;
  subsrt_local = nptr;
  for (pcStack_18 = subsrt; *pcStack_18 != '\0' && local_1c == 0; pcStack_18 = pcStack_18 + 1) {
    if ((*subsrt_local < 'a') || ('z' < *subsrt_local)) {
      local_24 = (int)*subsrt_local;
    }
    else {
      local_24 = *subsrt_local + -0x20;
    }
    if ((*pcStack_18 < 'a') || ('z' < *pcStack_18)) {
      local_2c = (int)*pcStack_18;
    }
    else {
      local_2c = *pcStack_18 + -0x20;
    }
    local_1c = local_24 - local_2c;
    subsrt_local = subsrt_local + 1;
  }
  return local_1c;
}

Assistant:

static int substricmp(const char* nptr, const char* subsrt)
{
    int result = 0;
    while (((*subsrt) != '\0') && (result == 0))
    {
        result = TOUPPER(*nptr) - TOUPPER(*subsrt);
        nptr++;
        subsrt++;
    }
    return result;
}